

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

__m256i * fold_mul_and_sum_avx2(__m256i *partiala,__m256i *partialb,__m256i *const1,__m256i *const2)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  __m256i *in_RDI;
  __m256i tmp;
  
  auVar1._8_4_ = 0x3020504;
  auVar1._12_4_ = 0xf0e0100;
  auVar1._0_4_ = 0xb0a0d0c;
  auVar1._4_4_ = 0x7060908;
  auVar1._16_4_ = 0xb0a0d0c;
  auVar1._20_4_ = 0x7060908;
  auVar1._24_4_ = 0x3020504;
  auVar1._28_4_ = 0xf0e0100;
  auVar1 = vpshufb_avx2(*in_RSI,auVar1);
  *in_RSI = auVar1;
  alVar3 = *in_RDI;
  alVar2 = (__m256i)vpunpcklwd_avx2((undefined1  [32])*in_RDI,*in_RSI);
  *in_RDI = alVar2;
  auVar1 = vpunpckhwd_avx2((undefined1  [32])alVar3,*in_RSI);
  *in_RSI = auVar1;
  alVar2 = (__m256i)vpmaddwd_avx2((undefined1  [32])*in_RDI,(undefined1  [32])*in_RDI);
  *in_RDI = alVar2;
  auVar1 = vpmaddwd_avx2(*in_RSI,*in_RSI);
  *in_RSI = auVar1;
  alVar2 = (__m256i)vpmulld_avx2((undefined1  [32])*in_RDI,*in_RDX);
  *in_RDI = alVar2;
  auVar1 = vpmulld_avx2(*in_RSI,*in_RCX);
  *in_RSI = auVar1;
  alVar2 = (__m256i)vpaddd_avx2((undefined1  [32])*in_RDI,*in_RSI);
  *in_RDI = alVar2;
  return in_RDI;
}

Assistant:

static inline __m256i fold_mul_and_sum_avx2(__m256i *partiala,
                                            __m256i *partialb,
                                            const __m256i *const1,
                                            const __m256i *const2) {
  // Mask used to shuffle the elements present in 256bit register.
  static const int shuffle_reg_256bit[8] = { 0x0b0a0d0c, 0x07060908, 0x03020504,
                                             0x0f0e0100, 0x0b0a0d0c, 0x07060908,
                                             0x03020504, 0x0f0e0100 };
  __m256i tmp;
  /* Reverse partial B. */
  *partialb = _mm256_shuffle_epi8(
      *partialb, _mm256_loadu_si256((const __m256i *)shuffle_reg_256bit));

  /* Interleave the x and y values of identical indices and pair x8 with 0. */
  tmp = *partiala;
  *partiala = _mm256_unpacklo_epi16(*partiala, *partialb);
  *partialb = _mm256_unpackhi_epi16(tmp, *partialb);

  /* Square and add the corresponding x and y values. */
  *partiala = _mm256_madd_epi16(*partiala, *partiala);
  *partialb = _mm256_madd_epi16(*partialb, *partialb);
  /* Multiply by constant. */
  *partiala = _mm256_mullo_epi32(*partiala, *const1);
  *partialb = _mm256_mullo_epi32(*partialb, *const2);
  /* Sum all results. */
  *partiala = _mm256_add_epi32(*partiala, *partialb);
  return *partiala;
}